

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_ldrex(DisasContext_conflict1 *s,arg_LDREX *a,MemOp mop,_Bool acq)

{
  int iVar1;
  int iVar2;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  TCGContext_conflict1 *s_02;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  uint uVar3;
  TCGTemp *pTVar4;
  TCGTemp *a2;
  TCGv_i64 val;
  TCGTemp *pTVar5;
  TCGv_i32 hi;
  MemOp opc;
  TCGv_i32 var;
  TCGv_i32 lo;
  uintptr_t o_3;
  TCGv_i32 var_00;
  uintptr_t o;
  TCGv_i32 val_00;
  TCGv_i64 ret;
  
  if ((a->rn != 0xf) && (iVar1 = a->rt, iVar1 != 0xf)) {
    s_00 = s->uc->tcg_ctx;
    uVar3 = (uint)s->features & 0x8000200;
    if (((uVar3 == 0x8000000) || ((iVar1 != 0xd || (s->thumb == 0)))) &&
       ((mop != MO_64 ||
        ((iVar2 = a->rt2, iVar1 != iVar2 && iVar2 != 0xf &&
         (((uVar3 == 0x8000000 || (iVar2 != 0xd)) || (s->thumb == 0)))))))) {
      pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,true);
      var_00 = (TCGv_i32)((long)pTVar4 - (long)s_00);
      load_reg_var(s,var_00,a->rn);
      tcg_gen_addi_i32_aarch64(s_00,var_00,var_00,a->imm);
      iVar1 = a->rt;
      iVar2 = a->rt2;
      s_01 = s->uc->tcg_ctx;
      pTVar4 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
      val_00 = (TCGv_i32)((long)pTVar4 - (long)s_01);
      opc = s->be_data | mop | MO_ALIGN;
      s->is_ldex = true;
      if (mop == MO_64) {
        pTVar4 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
        a2 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I64,false);
        val = (TCGv_i64)((long)a2 - (long)s_01);
        s_02 = s->uc->tcg_ctx;
        pTVar5 = tcg_temp_new_internal_aarch64(s_02,TCG_TYPE_I64,false);
        ret = (TCGv_i64)((long)pTVar5 - (long)s_02);
        tcg_gen_extu_i32_i64_aarch64(s_02,ret,var_00);
        tcg_gen_qemu_ld_i64_aarch64(s_01,val,ret,(ulong)(s->mmu_idx & 0xf),opc);
        tcg_temp_free_internal_aarch64(s_01,(TCGTemp *)(ret + (long)s_01));
        if (s_01->cpu_exclusive_val != val) {
          tcg_gen_op2_aarch64(s_01,INDEX_op_mov_i64,(TCGArg)(s_01->cpu_exclusive_val + (long)s_01),
                              (TCGArg)a2);
        }
        var = (TCGv_i32)((long)pTVar4 - (long)s_01);
        hi = var;
        lo = val_00;
        if (s->be_data == MO_BE) {
          hi = val_00;
          lo = var;
        }
        tcg_gen_extr_i64_i32_aarch64(s_01,lo,hi,val);
        tcg_temp_free_internal_aarch64(s_01,(TCGTemp *)(val + (long)s_01));
        store_reg(s,iVar2,var);
      }
      else {
        gen_aa32_ld_i32(s,val_00,var_00,s->mmu_idx & 0xf,opc);
        tcg_gen_extu_i32_i64_aarch64(s_01,s_01->cpu_exclusive_val,val_00);
      }
      store_reg(s,iVar1,val_00);
      tcg_gen_extu_i32_i64_aarch64(s_01,s_01->cpu_exclusive_addr,var_00);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var_00 + (long)s_00));
      if (!acq) {
        return (_Bool)extraout_AL_00;
      }
      tcg_gen_mb_aarch64(s_00,TCG_BAR_LDAQ|TCG_MO_ALL);
      return (_Bool)extraout_AL_01;
    }
  }
  unallocated_encoding_aarch64(s);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_ldrex(DisasContext *s, arg_LDREX *a, MemOp mop, bool acq)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr;
    /* Some cases stopped being UNPREDICTABLE in v8A (but not v8M) */
    bool v8a = ENABLE_ARCH_8 && !arm_dc_feature(s, ARM_FEATURE_M);

    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rn == 15 || a->rt == 15
        || (!v8a && s->thumb && a->rt == 13)
        || (mop == MO_64
            && (a->rt2 == 15 || a->rt == a->rt2
                || (!v8a && s->thumb && a->rt2 == 13)))) {
        unallocated_encoding(s);
        return true;
    }

    addr = tcg_temp_local_new_i32(tcg_ctx);
    load_reg_var(s, addr, a->rn);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, a->imm);

    gen_load_exclusive(s, a->rt, a->rt2, addr, mop);
    tcg_temp_free_i32(tcg_ctx, addr);

    if (acq) {
        tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_LDAQ);
    }
    return true;
}